

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spcdas.cpp
# Opt level: O2

word atoh(char *s)

{
  char cVar1;
  size_t sVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  byte bVar7;
  
  sVar2 = strlen(s);
  lVar4 = 0;
  uVar5 = 0;
  if (0 < (int)sVar2) {
    uVar5 = sVar2 & 0xffffffff;
  }
  lVar3 = sVar2 << 0x20;
  uVar6 = 0;
  do {
    lVar3 = lVar3 + -0x100000000;
    if (uVar5 * 4 == lVar4) {
      return (word)uVar6;
    }
    cVar1 = s[lVar3 >> 0x20];
    bVar7 = cVar1 - 0x30;
    if (9 < bVar7) {
      if ((byte)(cVar1 + 0xbfU) < 6) {
        bVar7 = cVar1 - 0x37;
      }
      else {
        if (5 < (byte)(cVar1 + 0x9fU)) {
          printf("error: invalid hex code [%s] - defaulting to 0000\n",s);
          return 0;
        }
        bVar7 = cVar1 + 0xa9;
      }
    }
    uVar6 = uVar6 | (uint)bVar7 << ((byte)lVar4 & 0x1f);
    lVar4 = lVar4 + 4;
  } while( true );
}

Assistant:

word atoh(char *s) {
int i, sl=strlen(s);
byte x;
word r = 0;
  for(i=0;i<sl;i++) {
    x=s[(sl-1)-i];
    if(x>='0'&&x<='9')x-='0';
    else if(x>='A'&&x<='F')x-='A'-0x0a;
    else if(x>='a'&&x<='f')x-='a'-0x0a;
    else {
      printf("error: invalid hex code [%s] - defaulting to 0000\n", s);
      return 0;
    }
    r|=x<<(i<<2);
  }
  return r;
}